

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O1

void install_subsample_code(FMFormat f,char *field,char *code_str)

{
  int iVar1;
  _func_int_cod_exec_context_void_ptr_int *p_Var2;
  int iVar3;
  FMFormat context;
  cod_code code;
  field_marshal_info_conflict pfVar4;
  cod_exec_context pcVar5;
  FMFormat format;
  ulong uVar6;
  ulong uVar7;
  char *__format;
  FMFieldList p_Var8;
  
  context = (FMFormat)new_cod_parse_context();
  install_subsample_code::externs[0].extern_value = printf;
  install_subsample_code::externs[1].extern_value = malloc;
  install_subsample_code::externs[2].extern_value = memcpy;
  install_subsample_code::externs[3].extern_value = copy_array_element;
  iVar1 = f->field_count;
  if ((long)iVar1 < 1) {
    iVar3 = -1;
  }
  else {
    p_Var8 = f->field_list;
    uVar7 = 0xffffffff;
    uVar6 = 0;
    do {
      iVar3 = strcmp(p_Var8->field_name,field);
      if (iVar3 == 0) {
        uVar7 = uVar6 & 0xffffffff;
      }
      iVar3 = (int)uVar7;
      uVar6 = uVar6 + 1;
      p_Var8 = p_Var8 + 1;
    } while ((long)iVar1 != uVar6);
  }
  if (iVar3 == -1) {
    __format = "field \"%s\" not found in install subsample code\n";
  }
  else {
    format = context;
    cod_add_param("ec","cod_exec_context",0,(cod_parse_context)context);
    add_param((cod_parse_context)context,(char *)0x1,(int)f,format);
    cod_add_param("element_count","int",2,(cod_parse_context)context);
    cod_set_return_type("void",(cod_parse_context)context);
    cod_assoc_externs((cod_parse_context)context,install_subsample_code::externs);
    cod_parse_for_context(install_subsample_code::extern_string,(cod_parse_context)context);
    code = cod_code_gen(code_str,(cod_parse_context)context);
    cod_free_parse_context((cod_parse_context)context);
    if (code != (cod_code)0x0) {
      p_Var2 = (_func_int_cod_exec_context_void_ptr_int *)code->func;
      pfVar4 = add_marshal_info(f);
      pcVar5 = cod_create_exec_context(code);
      pfVar4->ec = pcVar5;
      pfVar4->t = &f->var_list[iVar3].type_desc;
      pfVar4->type = FFSSubsampleArrayField;
      pfVar4->subsample_array_func = p_Var2;
      return;
    }
    __format = "Compilation failed, field \"%s\" in install subsample code \n";
  }
  printf(__format,field);
  return;
}

Assistant:

extern void
install_subsample_code(FMFormat f, char *field, char*code_str)
{
    cod_code code;
    int (*func)(cod_exec_context, void *, int);
    field_marshal_info marshal_info;
    cod_parse_context parse_context = new_cod_parse_context();
    int i, field_num = -1;

    static char extern_string[] = "\
		int printf(string format, ...);\n\
		void *malloc(int size);\n\
		void memcpy(void* dest, void* src, int size);\n\
        void FFSMarshalArrayElement(cod_exec_context ec, int element);";

    static cod_extern_entry externs[] = {
	{"printf", (void *) 0},
	{"malloc", (void*) 0},
	{"memcpy", (void*) 0},
	{"FFSMarshalArrayElement", (void*) 0},
	{(void *) 0, (void *) 0}
    };

    /*
     * some compilers think it isn't a static initialization to put this
     * in the structure above, so do it explicitly.
     */
    externs[0].extern_value = (void *) (intptr_t) printf;
    externs[1].extern_value = (void *) (intptr_t) malloc;
    externs[2].extern_value = (void *) (intptr_t) memcpy;
    externs[3].extern_value = (void *) (intptr_t) copy_array_element;


    for (i=0; i< f->field_count; i++) {
	if (strcmp(f->field_list[i].field_name, field) == 0) field_num = i;
    }
    if (field_num == -1) {
	printf("field \"%s\" not found in install subsample code\n", field);
	return;
    }
    cod_add_param("ec", "cod_exec_context", 0, parse_context);
    add_param(parse_context, "input", 1, f);
    cod_add_param("element_count", "int", 2, parse_context);

    cod_set_return_type("void", parse_context);
    cod_assoc_externs(parse_context, externs);
    cod_parse_for_context(extern_string, parse_context);

    code = cod_code_gen(code_str, parse_context);
    cod_free_parse_context(parse_context);
    if (code == NULL) {
	printf("Compilation failed, field \"%s\" in install subsample code \n", field);
	return;
    }
    func = (int(*)(cod_exec_context, void *, int))code->func;
    marshal_info = add_marshal_info(f);
    marshal_info->ec = cod_create_exec_context(code);
    marshal_info->t = &f->var_list[field_num].type_desc;
    marshal_info->type = FFSSubsampleArrayField;
    marshal_info->subsample_array_func = func;
}